

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Boundary_matrix.h
# Opt level: O3

void __thiscall
Gudhi::persistence_matrix::
Boundary_matrix<Gudhi::persistence_matrix::Matrix<RU_vine_options<(Gudhi::persistence_matrix::Column_types)7,true,false,true,false,true>>>
::_container_insert<std::initializer_list<unsigned_int>>
          (Boundary_matrix<Gudhi::persistence_matrix::Matrix<RU_vine_options<(Gudhi::persistence_matrix::Column_types)7,true,false,true,false,true>>>
           *this,initializer_list<unsigned_int> *column,Index pos,Dimension dim)

{
  Delete_disposer disposer;
  size_type sVar1;
  iterator puVar2;
  pointer pEVar3;
  data_t *pdVar4;
  node_ptr to_erase;
  pointer pEVar5;
  ulong uVar6;
  ulong uVar7;
  long lVar8;
  list_impl<boost::intrusive::bhtraits<Gudhi::persistence_matrix::Entry<Gudhi::persistence_matrix::Matrix<RU_vine_options<(Gudhi::persistence_matrix::Column_types)7,true,false,true,false,true>>>,boost::intrusive::list_node_traits<void*>,(boost::intrusive::link_mode_type)1,Gudhi::persistence_matrix::Matrix<RU_vine_options<(Gudhi::persistence_matrix::Column_types)7,true,false,true,false,true>>::Matrix_column_tag,1u>,unsigned_long,false,void>
  *this_00;
  Dimension local_68;
  uint local_64;
  Dimension local_60;
  Field_operators *local_58;
  New_cloner local_50;
  undefined1 local_48 [24];
  
  lVar8 = *(long *)(this + 0x38);
  uVar6 = (*(long *)(this + 0x40) - lVar8 >> 3) * -0x3333333333333333;
  uVar7 = (ulong)pos;
  local_68 = dim;
  if (uVar6 < uVar7 || uVar6 - uVar7 == 0) {
    std::
    vector<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<RU_vine_options<(Gudhi::persistence_matrix::Column_types)7,true,false,true,false,true>>>,std::allocator<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<RU_vine_options<(Gudhi::persistence_matrix::Column_types)7,true,false,true,false,true>>>>>
    ::
    emplace_back<std::initializer_list<unsigned_int>const&,int&,Gudhi::persistence_matrix::Matrix<RU_vine_options<(Gudhi::persistence_matrix::Column_types)7,true,false,true,false,true>>::Column_z2_settings*&>
              ((vector<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<RU_vine_options<(Gudhi::persistence_matrix::Column_types)7,true,false,true,false,true>>>,std::allocator<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<RU_vine_options<(Gudhi::persistence_matrix::Column_types)7,true,false,true,false,true>>>>>
                *)(this + 0x38),column,&local_68,(Column_z2_settings **)(this + 0x58));
  }
  else {
    local_50.entryPool_ = *(Entry_constructor **)(this + 0x58);
    sVar1 = column->_M_len;
    local_58 = (Field_operators *)0x0;
    local_60 = dim;
    local_48._0_8_ = (pointer)local_48;
    local_48._8_8_ = (pointer)local_48;
    if (sVar1 != 0) {
      puVar2 = column->_M_array;
      lVar8 = 0;
      local_48._16_8_ =
           (vector<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<RU_vine_options<(Gudhi::persistence_matrix::Column_types)7,true,false,true,false,true>>>,std::allocator<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<RU_vine_options<(Gudhi::persistence_matrix::Column_types)7,true,false,true,false,true>>>>>
            *)(this + 0x38);
      do {
        local_64 = *(uint *)((long)puVar2 + lVar8);
        pEVar5 = Simple_object_pool<Gudhi::persistence_matrix::Entry<Gudhi::persistence_matrix::Matrix<RU_vine_options<(Gudhi::persistence_matrix::Column_types)7,true,false,true,false,true>>>>
                 ::construct<unsigned_int&>
                           ((Simple_object_pool<Gudhi::persistence_matrix::Entry<Gudhi::persistence_matrix::Matrix<RU_vine_options<(Gudhi::persistence_matrix::Column_types)7,true,false,true,false,true>>>>
                             *)local_50.entryPool_,&local_64);
        if ((pEVar5->super_Column_hook).super_type.super_type.super_list_node<void_*>.next_ !=
            (node_ptr)0x0) {
          __assert_fail("!safemode_or_autounlink || node_algorithms::inited(to_insert)",
                        "/usr/include/boost/intrusive/list.hpp",0x33c,
                        "iterator boost::intrusive::list_impl<boost::intrusive::bhtraits<Gudhi::persistence_matrix::Entry<Gudhi::persistence_matrix::Matrix<RU_vine_options<Gudhi::persistence_matrix::Column_types::INTRUSIVE_LIST, true, false, true, false, true>>>, boost::intrusive::list_node_traits<void *>, boost::intrusive::safe_link, Gudhi::persistence_matrix::Matrix<RU_vine_options<Gudhi::persistence_matrix::Column_types::INTRUSIVE_LIST, true, false, true, false, true>>::Matrix_column_tag, 1>, unsigned long, false, void>::insert(const_iterator, reference) [ValueTraits = boost::intrusive::bhtraits<Gudhi::persistence_matrix::Entry<Gudhi::persistence_matrix::Matrix<RU_vine_options<Gudhi::persistence_matrix::Column_types::INTRUSIVE_LIST, true, false, true, false, true>>>, boost::intrusive::list_node_traits<void *>, boost::intrusive::safe_link, Gudhi::persistence_matrix::Matrix<RU_vine_options<Gudhi::persistence_matrix::Column_types::INTRUSIVE_LIST, true, false, true, false, true>>::Matrix_column_tag, 1>, SizeType = unsigned long, ConstantTimeSize = false, HeaderHolder = void]"
                       );
        }
        (pEVar5->super_Column_hook).super_type.super_type.super_list_node<void_*>.prev_ =
             (node_ptr)local_48._8_8_;
        (pEVar5->super_Column_hook).super_type.super_type.super_list_node<void_*>.next_ =
             (node_ptr)local_48;
        pdVar4 = (data_t *)local_48._8_8_;
        local_48._8_8_ = pEVar5;
        (pdVar4->root_plus_size_).m_header.super_node.next_ = (node_ptr)pEVar5;
        lVar8 = lVar8 + 4;
      } while (sVar1 << 2 != lVar8);
      lVar8 = *(long *)local_48._16_8_;
    }
    disposer.col_ =
         (Intrusive_list_column<Gudhi::persistence_matrix::Matrix<RU_vine_options<(Gudhi::persistence_matrix::Column_types)7,_true,_false,_true,_false,_true>_>_>
          *)(lVar8 + uVar7 * 0x28);
    ((disposer.col_)->super_Column_dimension_option).dim_ = local_60;
    this_00 = (list_impl<boost::intrusive::bhtraits<Gudhi::persistence_matrix::Entry<Gudhi::persistence_matrix::Matrix<RU_vine_options<(Gudhi::persistence_matrix::Column_types)7,true,false,true,false,true>>>,boost::intrusive::list_node_traits<void*>,(boost::intrusive::link_mode_type)1,Gudhi::persistence_matrix::Matrix<RU_vine_options<(Gudhi::persistence_matrix::Column_types)7,true,false,true,false,true>>::Matrix_column_tag,1u>,unsigned_long,false,void>
               *)(lVar8 + uVar7 * 0x28 + 0x18);
    boost::intrusive::
    list_impl<boost::intrusive::bhtraits<Gudhi::persistence_matrix::Entry<Gudhi::persistence_matrix::Matrix<RU_vine_options<(Gudhi::persistence_matrix::Column_types)7,true,false,true,false,true>>>,boost::intrusive::list_node_traits<void*>,(boost::intrusive::link_mode_type)1,Gudhi::persistence_matrix::Matrix<RU_vine_options<(Gudhi::persistence_matrix::Column_types)7,true,false,true,false,true>>::Matrix_column_tag,1u>,unsigned_long,false,void>
    ::
    clear_and_dispose<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<RU_vine_options<(Gudhi::persistence_matrix::Column_types)7,true,false,true,false,true>>>::Delete_disposer>
              (this_00,disposer);
    (disposer.col_)->operators_ = local_58;
    (disposer.col_)->entryPool_ = local_50.entryPool_;
    boost::intrusive::
    list_impl<boost::intrusive::bhtraits<Gudhi::persistence_matrix::Entry<Gudhi::persistence_matrix::Matrix<RU_vine_options<(Gudhi::persistence_matrix::Column_types)7,true,false,true,false,true>>>,boost::intrusive::list_node_traits<void*>,(boost::intrusive::link_mode_type)1,Gudhi::persistence_matrix::Matrix<RU_vine_options<(Gudhi::persistence_matrix::Column_types)7,true,false,true,false,true>>::Matrix_column_tag,1u>,unsigned_long,false,void>
    ::
    clone_from<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<RU_vine_options<(Gudhi::persistence_matrix::Column_types)7,true,false,true,false,true>>>::New_cloner,Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<RU_vine_options<(Gudhi::persistence_matrix::Column_types)7,true,false,true,false,true>>>::Delete_disposer>
              (this_00,(list_impl<boost::intrusive::bhtraits<Gudhi::persistence_matrix::Entry<Gudhi::persistence_matrix::Matrix<RU_vine_options<(Gudhi::persistence_matrix::Column_types)7,_true,_false,_true,_false,_true>_>_>,_boost::intrusive::list_node_traits<void_*>,_(boost::intrusive::link_mode_type)1,_Gudhi::persistence_matrix::Matrix<RU_vine_options<(Gudhi::persistence_matrix::Column_types)7,_true,_false,_true,_false,_true>_>::Matrix_column_tag,_1U>,_unsigned_long,_false,_void>
                        *)local_48,local_50,disposer);
    pEVar5 = (pointer)local_48._0_8_;
    while (pEVar5 != (pointer)local_48) {
      pEVar3 = (pointer)(pEVar5->super_Column_hook).super_type.super_type.super_list_node<void_*>.
                        next_;
      (pEVar5->super_Column_hook).super_type.super_type.super_list_node<void_*>.next_ =
           (node_ptr)0x0;
      (pEVar5->super_Column_hook).super_type.super_type.super_list_node<void_*>.prev_ =
           (node_ptr)0x0;
      Simple_object_pool<Gudhi::persistence_matrix::Entry<Gudhi::persistence_matrix::Matrix<RU_vine_options<(Gudhi::persistence_matrix::Column_types)7,_true,_false,_true,_false,_true>_>_>_>
      ::destroy(&(local_50.entryPool_)->entryPool_,pEVar5);
      pEVar5 = pEVar3;
    }
  }
  return;
}

Assistant:

inline void Boundary_matrix<Master_matrix>::_container_insert(const Container& column,
                                                              Index pos,
                                                              Dimension dim)
{
  if constexpr (Master_matrix::Option_list::has_map_column_container) {
    if constexpr (Master_matrix::Option_list::has_row_access) {
      matrix_.try_emplace(pos, Column(pos, column, dim, RA_opt::rows_, colSettings_));
    } else {
      matrix_.try_emplace(pos, Column(column, dim, colSettings_));
    }
  } else {
    if constexpr (Master_matrix::Option_list::has_row_access) {
      matrix_.emplace_back(pos, column, dim, RA_opt::rows_, colSettings_);
    } else {
      if (matrix_.size() <= pos) {
        matrix_.emplace_back(column, dim, colSettings_);
      } else {
        matrix_[pos] = Column(column, dim, colSettings_);
      }
    }
  }
  if constexpr (activeDimOption) {
    Dim_opt::update_up(dim);
  }
}